

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_buffer.cpp
# Opt level: O0

BmsWord __thiscall BmsBuffer::Get(BmsBuffer *this,barindex pos)

{
  bool bVar1;
  mapped_type *pmVar2;
  undefined4 in_register_00000034;
  long lVar3;
  _Self local_30;
  _Self local_28;
  key_type local_1c;
  long lStack_18;
  barindex pos_local;
  BmsBuffer *this_local;
  
  lVar3 = CONCAT44(in_register_00000034,pos);
  lStack_18 = lVar3;
  this_local = this;
  local_28._M_node =
       (_Base_ptr)
       std::map<int,_BmsWord,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>::find
                 ((map<int,_BmsWord,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>
                   *)(lVar3 + 8),&local_1c);
  local_30._M_node =
       (_Base_ptr)
       std::map<int,_BmsWord,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>::end
                 ((map<int,_BmsWord,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>
                   *)(lVar3 + 8));
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    BmsWord::BmsWord((BmsWord *)this,0);
  }
  else {
    pmVar2 = std::map<int,_BmsWord,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>
             ::at((map<int,_BmsWord,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>
                   *)(lVar3 + 8),&local_1c);
    *(int *)&this->_vptr_BmsBuffer = pmVar2->value_;
  }
  return (BmsWord)(int)this;
}

Assistant:

BmsWord
BmsBuffer::Get(barindex pos) const
{
	if (array_.find(pos) == array_.end()) return 0;
	else return array_.at(pos);
}